

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cpp
# Opt level: O1

void __thiscall ArgsManager::LogArgs(ArgsManager *this)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  char *__end;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view source_file;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock25;
  string local_78;
  string local_58;
  undefined8 local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  criticalblock25.super_unique_lock._M_owns = false;
  criticalblock25.super_unique_lock._M_device = (mutex_type *)this;
  std::unique_lock<std::recursive_mutex>::lock(&criticalblock25.super_unique_lock);
  p_Var2 = (this->m_settings).ro_config._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->m_settings).ro_config._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var2 != p_Var1) {
    do {
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"Config file arg:","");
      logArgsPrefix(this,&local_58,(string *)(p_Var2 + 1),
                    (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
                     *)(p_Var2 + 2));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
    } while ((_Rb_tree_header *)p_Var2 != p_Var1);
  }
  p_Var2 = (this->m_settings).rw_settings._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->m_settings).rw_settings._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var2 != p_Var1) {
    do {
      UniValue::write_abi_cxx11_((UniValue *)&local_58,(int)p_Var2 + 0x40,(void *)0x0,0);
      logging_function._M_str = "LogArgs";
      logging_function._M_len = 7;
      source_file._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/common/args.cpp"
      ;
      source_file._M_len = 0x5f;
      LogPrintFormatInternal<std::__cxx11::string,std::__cxx11::string>
                (logging_function,source_file,0x35e,ALL,Info,(ConstevalFormatString<2U>)0x1ad094,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var2 + 1),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_58);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
    } while ((_Rb_tree_header *)p_Var2 != p_Var1);
  }
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"Command-line arg:","");
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"");
  logArgsPrefix(this,&local_58,&local_78,&(this->m_settings).command_line_options);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock25.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void ArgsManager::LogArgs() const
{
    LOCK(cs_args);
    for (const auto& section : m_settings.ro_config) {
        logArgsPrefix("Config file arg:", section.first, section.second);
    }
    for (const auto& setting : m_settings.rw_settings) {
        LogPrintf("Setting file arg: %s = %s\n", setting.first, setting.second.write());
    }
    logArgsPrefix("Command-line arg:", "", m_settings.command_line_options);
}